

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int set_snode_insert_node(lyxp_set *set,lys_node *node,lyxp_node_type node_type)

{
  uint uVar1;
  lyxp_set_nodes *ptr;
  LY_ERR *pLVar2;
  
  if (set->type != LYXP_SET_SNODE_SET) {
    __assert_fail("set->type == LYXP_SET_SNODE_SET",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                  ,0x3ac,
                  "int set_snode_insert_node(struct lyxp_set *, const struct lys_node *, enum lyxp_node_type)"
                 );
  }
  uVar1 = set_snode_dup_node_check(set,node,node_type,-1);
  if ((int)uVar1 < 0) {
    uVar1 = set->used;
    ptr = (set->val).nodes;
    if (uVar1 == set->size) {
      ptr = (lyxp_set_nodes *)ly_realloc(ptr,(ulong)(uVar1 + 2) << 4);
      (set->val).nodes = ptr;
      if (ptr == (lyxp_set_nodes *)0x0) {
        pLVar2 = ly_errno_location();
        *pLVar2 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","set_snode_insert_node");
        return -1;
      }
      set->size = set->size + 2;
      uVar1 = set->used;
    }
    ptr[(int)uVar1].node = (lyd_node *)node;
    (set->val).nodes[(int)uVar1].type = node_type;
    (set->val).nodes[(int)uVar1].pos = 1;
    set->used = uVar1 + 1;
  }
  else {
    (set->val).nodes[uVar1].pos = 1;
  }
  return uVar1;
}

Assistant:

static int
set_snode_insert_node(struct lyxp_set *set, const struct lys_node *node, enum lyxp_node_type node_type)
{
    int ret;

    assert(set->type == LYXP_SET_SNODE_SET);

    ret = set_snode_dup_node_check(set, node, node_type, -1);
    if (ret > -1) {
        set->val.snodes[ret].in_ctx = 1;
    } else {
        if (set->used == set->size) {
            set->val.snodes = ly_realloc(set->val.snodes, (set->size + LYXP_SET_SIZE_STEP) * sizeof *set->val.snodes);
            if (!set->val.snodes) {
                LOGMEM;
                return -1;
            }
            set->size += LYXP_SET_SIZE_STEP;
        }

        ret = set->used;
        set->val.snodes[ret].snode = (struct lys_node *)node;
        set->val.snodes[ret].type = node_type;
        set->val.snodes[ret].in_ctx = 1;
        ++set->used;
    }

    return ret;
}